

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_compress.c
# Opt level: O0

wchar_t output_flush(archive_write_filter *f)

{
  archive_write_filter *f_00;
  wchar_t wVar1;
  long in_RDI;
  wchar_t ret;
  private_data_conflict3 *state;
  undefined4 in_stack_ffffffffffffffe4;
  
  f_00 = *(archive_write_filter **)(in_RDI + 0x40);
  if (*(int *)((long)&f_00[0x10d9].archive + 4) % 8 != 0) {
    *(int *)&f_00->options = (*(int *)((long)&f_00[0x10d9].archive + 4) % 8 + 7) / 8;
    wVar1 = output_byte(f_00,(uchar)((uint)in_stack_ffffffffffffffe4 >> 0x18));
    if (wVar1 != L'\0') {
      return wVar1;
    }
  }
  return L'\0';
}

Assistant:

static int
output_flush(struct archive_write_filter *f)
{
	struct private_data *state = f->data;
	int ret;

	/* At EOF, write the rest of the buffer. */
	if (state->bit_offset % 8) {
		state->code_len = (state->bit_offset % 8 + 7) / 8;
		ret = output_byte(f, state->bit_buf);
		if (ret != ARCHIVE_OK)
			return ret;
	}

	return (ARCHIVE_OK);
}